

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getarg_tests.cpp
# Opt level: O2

void __thiscall getarg_tests::logargs::test_method(logargs *this)

{
  long lVar1;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  fun;
  Logger *pLVar2;
  iterator it;
  size_type sVar3;
  long lVar4;
  iterator in_R8;
  iterator pvVar5;
  iterator in_R9;
  iterator pvVar6;
  long in_FS_OFFSET;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  __l;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  undefined4 in_stack_fffffffffffffb38;
  undefined4 in_stack_fffffffffffffb3c;
  check_type cVar7;
  _Manager_type in_stack_fffffffffffffb48;
  _Invoker_type in_stack_fffffffffffffb50;
  undefined1 *local_4a8;
  undefined1 *local_4a0;
  char *local_498;
  char *local_490;
  char *local_488;
  char *local_480;
  undefined1 *local_478;
  undefined1 *local_470;
  char *local_468;
  char *local_460;
  char *local_458;
  char *local_450;
  undefined1 *local_448;
  undefined1 *local_440;
  char *local_438;
  char *local_430;
  char *local_428;
  char *local_420;
  undefined1 *local_418;
  undefined1 *local_410;
  char *local_408;
  char *local_400;
  char *local_3f8;
  char *local_3f0;
  char *local_3e8;
  char *local_3e0;
  undefined1 local_3d8 [16];
  undefined1 *local_3c8;
  char **local_3c0;
  assertion_result local_3b8;
  undefined1 *local_3a0;
  undefined1 *local_398;
  char *local_390;
  char *local_388;
  _Any_data local_380;
  code *local_370;
  code *local_368;
  pair<const_char_*,_unsigned_int> local_360;
  pair<const_char_*,_ArgsManager::Flags> local_350;
  pair<const_char_*,_ArgsManager::Flags> local_340;
  pair<const_char_*,_ArgsManager::Flags> local_330;
  string str;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_2f8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_2d0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_2a8;
  ArgsManager local_args;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ArgsManager::ArgsManager(&local_args);
  local_330.first = "-okaylog-bool";
  local_350.second = ALLOW_ANY;
  local_340.first = "-okaylog-negbool";
  local_350.first = "-okaylog";
  local_360.first = "-dontlog";
  local_360.second = 0x401;
  local_340.second = local_350.second;
  local_330.second = local_350.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_*,_ArgsManager::Flags,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
              *)&str,&local_330);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_*,_ArgsManager::Flags,_true>(&local_2f8,&local_340);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_*,_ArgsManager::Flags,_true>(&local_2d0,&local_350);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_*,_unsigned_int,_true>(&local_2a8,&local_360);
  __l._M_len = 4;
  __l._M_array = (iterator)&str;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
            *)local_3d8,__l,(allocator_type *)&local_3b8);
  SetupArgs(&local_args,
            (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             *)local_3d8);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             *)local_3d8);
  lVar4 = 0x78;
  do {
    std::__cxx11::string::~string((string *)((long)&str._M_dataplus._M_p + lVar4));
    lVar4 = lVar4 + -0x28;
  } while (lVar4 != -0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&str,"-okaylog-bool -nookaylog-negbool -okaylog=public -dontlog=private42",
             (allocator<char> *)local_3d8);
  ResetArgs(&local_args,&str);
  std::__cxx11::string::~string((string *)&str);
  str._M_dataplus._M_p = (pointer)&str.field_2;
  str._M_string_length = 0;
  str.field_2._M_local_buf[0] = '\0';
  pLVar2 = LogInstance();
  local_380._8_8_ = 0;
  local_368 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp:441:9)>
              ::_M_invoke;
  local_370 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp:441:9)>
              ::_M_manager;
  fun.super__Function_base._M_functor._4_4_ = in_stack_fffffffffffffb3c;
  fun.super__Function_base._M_functor._0_4_ = in_stack_fffffffffffffb38;
  fun.super__Function_base._M_functor._8_8_ = (undefined8)_cVar7;
  fun.super__Function_base._M_manager = in_stack_fffffffffffffb48;
  fun._M_invoker = in_stack_fffffffffffffb50;
  local_380._M_unused._M_object = &str;
  it = BCLog::Logger::PushBackCallback(pLVar2,fun);
  std::_Function_base::~_Function_base((_Function_base *)&local_380);
  ArgsManager::LogArgs(&local_args);
  pLVar2 = LogInstance();
  BCLog::Logger::DeleteCallback(pLVar2,it);
  local_390 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_388 = "";
  local_3a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_398 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x1c2;
  file.m_begin = (iterator)&local_390;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_3a0,msg);
  sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    (&str,"Command-line arg: okaylog-bool=\"\"",0);
  local_3b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(sVar3 != 0xffffffffffffffff);
  local_3b8.m_message.px = (element_type *)0x0;
  local_3b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_3e8 = "str.find(\"Command-line arg: okaylog-bool=\\\"\\\"\") != std::string::npos";
  local_3e0 = "";
  local_3d8[8] = false;
  local_3d8._0_8_ = &PTR__lazy_ostream_011481f0;
  local_3c8 = boost::unit_test::lazy_ostream::inst;
  local_3f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_3f0 = "";
  pvVar5 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  local_3c0 = &local_3e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_3b8,(lazy_ostream *)local_3d8,1,0,WARN,_cVar7,(size_t)&local_3f8,0x1c2);
  boost::detail::shared_count::~shared_count(&local_3b8.m_message.pn);
  local_408 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_400 = "";
  local_418 = &boost::unit_test::basic_cstring<char_const>::null;
  local_410 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x1c3;
  file_00.m_begin = (iterator)&local_408;
  msg_00.m_end = pvVar6;
  msg_00.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_418,
             msg_00);
  sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    (&str,"Command-line arg: okaylog-negbool=false",0);
  local_3b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(sVar3 != 0xffffffffffffffff);
  local_3b8.m_message.px = (element_type *)0x0;
  local_3b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_3e8 = "str.find(\"Command-line arg: okaylog-negbool=false\") != std::string::npos";
  local_3e0 = "";
  local_3d8[8] = false;
  local_3d8._0_8_ = &PTR__lazy_ostream_011481f0;
  local_3c8 = boost::unit_test::lazy_ostream::inst;
  local_428 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_420 = "";
  pvVar5 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  local_3c0 = &local_3e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_3b8,(lazy_ostream *)local_3d8,1,0,WARN,_cVar7,(size_t)&local_428,0x1c3);
  boost::detail::shared_count::~shared_count(&local_3b8.m_message.pn);
  local_438 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_430 = "";
  local_448 = &boost::unit_test::basic_cstring<char_const>::null;
  local_440 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x1c4;
  file_01.m_begin = (iterator)&local_438;
  msg_01.m_end = pvVar6;
  msg_01.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_448,
             msg_01);
  sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    (&str,"Command-line arg: okaylog=\"public\"",0);
  local_3b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(sVar3 != 0xffffffffffffffff);
  local_3b8.m_message.px = (element_type *)0x0;
  local_3b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_3e8 = "str.find(\"Command-line arg: okaylog=\\\"public\\\"\") != std::string::npos";
  local_3e0 = "";
  local_3d8[8] = false;
  local_3d8._0_8_ = &PTR__lazy_ostream_011481f0;
  local_3c8 = boost::unit_test::lazy_ostream::inst;
  local_458 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_450 = "";
  pvVar5 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  local_3c0 = &local_3e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_3b8,(lazy_ostream *)local_3d8,1,0,WARN,_cVar7,(size_t)&local_458,0x1c4);
  boost::detail::shared_count::~shared_count(&local_3b8.m_message.pn);
  local_468 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_460 = "";
  local_478 = &boost::unit_test::basic_cstring<char_const>::null;
  local_470 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x1c5;
  file_02.m_begin = (iterator)&local_468;
  msg_02.m_end = pvVar6;
  msg_02.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_478,
             msg_02);
  sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    (&str,"dontlog=****",0);
  local_3b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(sVar3 != 0xffffffffffffffff);
  local_3b8.m_message.px = (element_type *)0x0;
  local_3b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_3e8 = "str.find(\"dontlog=****\") != std::string::npos";
  local_3e0 = "";
  local_3d8[8] = false;
  local_3d8._0_8_ = &PTR__lazy_ostream_011481f0;
  local_3c8 = boost::unit_test::lazy_ostream::inst;
  local_488 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_480 = "";
  pvVar5 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  local_3c0 = &local_3e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_3b8,(lazy_ostream *)local_3d8,1,0,WARN,_cVar7,(size_t)&local_488,0x1c5);
  boost::detail::shared_count::~shared_count(&local_3b8.m_message.pn);
  local_498 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_490 = "";
  local_4a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x1c6;
  file_03.m_begin = (iterator)&local_498;
  msg_03.m_end = pvVar6;
  msg_03.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_4a8,
             msg_03);
  sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    (&str,"private42",0);
  local_3b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(sVar3 == 0xffffffffffffffff);
  local_3b8.m_message.px = (element_type *)0x0;
  local_3b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_3e8 = "str.find(\"private42\") == std::string::npos";
  local_3e0 = "";
  local_3d8[8] = false;
  local_3d8._0_8_ = &PTR__lazy_ostream_011481f0;
  local_3c8 = boost::unit_test::lazy_ostream::inst;
  local_3c0 = &local_3e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_3b8,(lazy_ostream *)local_3d8,1,0,WARN,_cVar7,(size_t)&stack0xfffffffffffffb48,
             0x1c6);
  boost::detail::shared_count::~shared_count(&local_3b8.m_message.pn);
  std::__cxx11::string::~string((string *)&str);
  ArgsManager::~ArgsManager(&local_args);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(logargs)
{
    ArgsManager local_args;

    const auto okaylog_bool = std::make_pair("-okaylog-bool", ArgsManager::ALLOW_ANY);
    const auto okaylog_negbool = std::make_pair("-okaylog-negbool", ArgsManager::ALLOW_ANY);
    const auto okaylog = std::make_pair("-okaylog", ArgsManager::ALLOW_ANY);
    const auto dontlog = std::make_pair("-dontlog", ArgsManager::ALLOW_ANY | ArgsManager::SENSITIVE);
    SetupArgs(local_args, {okaylog_bool, okaylog_negbool, okaylog, dontlog});
    ResetArgs(local_args, "-okaylog-bool -nookaylog-negbool -okaylog=public -dontlog=private42");

    // Everything logged to debug.log will also append to str
    std::string str;
    auto print_connection = LogInstance().PushBackCallback(
        [&str](const std::string& s) {
            str += s;
        });

    // Log the arguments
    local_args.LogArgs();

    LogInstance().DeleteCallback(print_connection);
    // Check that what should appear does, and what shouldn't doesn't.
    BOOST_CHECK(str.find("Command-line arg: okaylog-bool=\"\"") != std::string::npos);
    BOOST_CHECK(str.find("Command-line arg: okaylog-negbool=false") != std::string::npos);
    BOOST_CHECK(str.find("Command-line arg: okaylog=\"public\"") != std::string::npos);
    BOOST_CHECK(str.find("dontlog=****") != std::string::npos);
    BOOST_CHECK(str.find("private42") == std::string::npos);
}